

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecFadds.c
# Opt level: O3

Tim_Man_t * Gia_ManGenerateTim(int nPis,int nPos,int nBoxes,int nIns,int nOuts)

{
  int iVar1;
  Vec_Ptr_t *vDelayTables;
  void **ppvVar2;
  float *pfVar3;
  Tim_Man_t *p;
  int firstIn;
  
  vDelayTables = (Vec_Ptr_t *)malloc(0x10);
  vDelayTables->nCap = 8;
  ppvVar2 = (void **)malloc(0x40);
  vDelayTables->pArray = ppvVar2;
  pfVar3 = Gia_ManGenerateDelayTableFloat(nIns,nOuts);
  vDelayTables->nSize = 1;
  *ppvVar2 = pfVar3;
  p = Tim_ManStart(nOuts * nBoxes + nPis,nIns * nBoxes + nPos);
  Tim_ManSetDelayTables(p,vDelayTables);
  firstIn = 0;
  if (0 < nBoxes) {
    do {
      Tim_ManCreateBox(p,firstIn,nIns,nPis,nOuts,0,0);
      nPis = nPis + nOuts;
      firstIn = firstIn + nIns;
      nBoxes = nBoxes + -1;
    } while (nBoxes != 0);
  }
  iVar1 = Tim_ManCiNum(p);
  if (nPis == iVar1) {
    iVar1 = Tim_ManCoNum(p);
    if (firstIn + nPos == iVar1) {
      return p;
    }
    __assert_fail("curPo == Tim_ManCoNum(pMan)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                  ,0x285,"Tim_Man_t *Gia_ManGenerateTim(int, int, int, int, int)");
  }
  __assert_fail("curPi == Tim_ManCiNum(pMan)",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/acec/acecFadds.c"
                ,0x284,"Tim_Man_t *Gia_ManGenerateTim(int, int, int, int, int)");
}

Assistant:

Tim_Man_t * Gia_ManGenerateTim( int nPis, int nPos, int nBoxes, int nIns, int nOuts )
{
    Tim_Man_t * pMan;
    int i, curPi, curPo;
    Vec_Ptr_t * vDelayTables = Vec_PtrAlloc( 1 );
    Vec_PtrPush( vDelayTables, Gia_ManGenerateDelayTableFloat(nIns, nOuts) );
    pMan = Tim_ManStart( nPis + nOuts * nBoxes, nPos + nIns * nBoxes );
    Tim_ManSetDelayTables( pMan, vDelayTables );
    curPi = nPis;
    curPo = 0;
    for ( i = 0; i < nBoxes; i++ )
    {
        Tim_ManCreateBox( pMan, curPo, nIns, curPi, nOuts, 0, 0 );
        curPi += nOuts;
        curPo += nIns;
    }
    curPo += nPos;
    assert( curPi == Tim_ManCiNum(pMan) );
    assert( curPo == Tim_ManCoNum(pMan) );
    //Tim_ManPrint( pMan );
    return pMan;
}